

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

repcodes_t ZSTD_updateRep(U32 *rep,U32 offset,U32 ll0)

{
  U32 *pUVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  repcodes_t rVar6;
  
  if (offset < 3) {
    uVar3 = ll0 + offset;
    if (uVar3 == 0) {
      uVar5 = *(ulong *)rep;
      uVar2 = uVar5 >> 0x20;
      pUVar1 = rep + 2;
    }
    else {
      if (uVar3 == 3) {
        uVar4 = *rep - 1;
      }
      else {
        uVar4 = rep[uVar3];
      }
      uVar5 = (ulong)uVar4;
      pUVar1 = rep + (ulong)(uVar3 == 1) + 1;
      uVar2 = (ulong)*rep;
    }
  }
  else {
    uVar2 = (ulong)*rep;
    pUVar1 = rep + 1;
    uVar5 = (ulong)(offset - 2);
  }
  rVar6.rep._0_8_ = uVar5 & 0xffffffff | uVar2 << 0x20;
  rVar6.rep[2] = *pUVar1;
  return (repcodes_t)rVar6.rep;
}

Assistant:

static repcodes_t ZSTD_updateRep(U32 const rep[3], U32 const offset, U32 const ll0)
{
    repcodes_t newReps;
    if (offset >= ZSTD_REP_NUM) {  /* full offset */
        newReps.rep[2] = rep[1];
        newReps.rep[1] = rep[0];
        newReps.rep[0] = offset - ZSTD_REP_MOVE;
    } else {   /* repcode */
        U32 const repCode = offset + ll0;
        if (repCode > 0) {  /* note : if repCode==0, no change */
            U32 const currentOffset = (repCode==ZSTD_REP_NUM) ? (rep[0] - 1) : rep[repCode];
            newReps.rep[2] = (repCode >= 2) ? rep[1] : rep[2];
            newReps.rep[1] = rep[0];
            newReps.rep[0] = currentOffset;
        } else {   /* repCode == 0 */
            memcpy(&newReps, rep, sizeof(newReps));
        }
    }
    return newReps;
}